

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  double *pdVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  ParticleArray particles;
  ParticleType particle;
  AssertionResult local_c8;
  AssertHelper local_b8;
  AssertionResult local_b0;
  long local_a0;
  vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  local_98;
  long *local_80 [2];
  Particle local_70;
  AssertHelper local_38;
  
  local_98.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Particle<(pica::Dimension)1> *)0x0;
  local_98.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Particle<(pica::Dimension)1> *)0x0;
  iVar5 = 0xd;
  do {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (&local_70,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this,
               (PositionType)0xc024000000000000,(PositionType)0x4024000000000000);
    if (local_98.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_98.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<pica::Particle<(pica::Dimension)1>,std::allocator<pica::Particle<(pica::Dimension)1>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)1>const&>
                ((vector<pica::Particle<(pica::Dimension)1>,std::allocator<pica::Particle<(pica::Dimension)1>>>
                  *)&local_98,
                 (iterator)
                 local_98.
                 super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_70);
    }
    else {
      *(ulong *)&(local_98.
                  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->typeIndex =
           CONCAT62(local_70._50_6_,local_70.typeIndex);
      (local_98.
       super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->factor = local_70.factor;
      (local_98.
       super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->invGamma = local_70.invGamma;
      ((local_98.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).y = local_70.p.y;
      ((local_98.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).z = local_70.p.z;
      ((local_98.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->position).x = local_70.position.x;
      ((local_98.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).x = local_70.p.x;
      local_98.
      super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.
           super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if ((local_70.position.x !=
         local_98.
         super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].position.x) ||
       (NAN(local_70.position.x) ||
        NAN(local_98.
            super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].position.x))) {
LAB_0019c998:
      local_b0.success_ = false;
LAB_0019c9a6:
      local_b0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)local_80);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_c8,&local_b0,"this->eqParticles_(particle, particles.back())",
                 "false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)CONCAT71(local_c8._1_7_,local_c8.success_));
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if ((void *)CONCAT71(local_c8._1_7_,local_c8.success_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_c8._1_7_,local_c8.success_));
      }
      if (((local_80[0] != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_80[0] != (long *)0x0)) {
        (**(code **)(*local_80[0] + 8))();
      }
    }
    else {
      dVar6 = *(double *)(pica::ParticleTypes::types + (long)local_70.typeIndex * 0x10);
      lVar4 = (long)local_98.
                    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].typeIndex * 0x10;
      dVar7 = *(double *)(pica::ParticleTypes::types + lVar4);
      if ((((dVar6 != dVar7) ||
           (((NAN(dVar6) || NAN(dVar7) ||
             (dVar8 = local_70.p.x * 29979245800.0 * dVar6,
             dVar9 = local_98.
                     super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].p.x * 29979245800.0 * dVar7,
             dVar8 != dVar9)) || (NAN(dVar8) || NAN(dVar9))))) ||
          ((((dVar8 = local_70.p.y * 29979245800.0 * dVar6,
             dVar9 = local_98.
                     super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].p.y * 29979245800.0 * dVar7,
             dVar8 != dVar9 || (NAN(dVar8) || NAN(dVar9))) ||
            (dVar6 = local_70.p.z * 29979245800.0 * dVar6,
            dVar7 = local_98.
                    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].p.z * 29979245800.0 * dVar7,
            dVar6 != dVar7)) ||
           ((NAN(dVar6) || NAN(dVar7) ||
            (dVar6 = *(double *)(pica::ParticleTypes::types + 8 + (long)local_70.typeIndex * 0x10),
            pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar4), dVar6 != *pdVar1)))))) ||
         (NAN(dVar6) || NAN(*pdVar1))) goto LAB_0019c998;
      dVar6 = local_98.
              super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].factor;
      local_b0.success_ = local_70.factor == dVar6;
      local_b0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_70.factor != dVar6) || (NAN(local_70.factor) || NAN(dVar6))) goto LAB_0019c9a6;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_b0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::
    vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
    ::vector((vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
              *)&local_b0,&local_98);
    if ((local_70.position.x != (double)local_b0.message_.ptr_[-2]._M_string_length) ||
       (NAN(local_70.position.x) || NAN((double)local_b0.message_.ptr_[-2]._M_string_length))) {
LAB_0019cb63:
      local_c8.success_ = false;
LAB_0019cb70:
      local_c8.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_b8);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_80,&local_c8,"this->eqParticles_(particle, particlesCopy.back())"
                 ,"false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,(char *)local_80[0]);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_80[0] != (long *)0x0) {
        operator_delete__(local_80[0]);
      }
      if (((local_b8.data_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_b8.data_ + 8))();
      }
    }
    else {
      dVar6 = *(double *)(pica::ParticleTypes::types + (long)local_70.typeIndex * 0x10);
      lVar4 = (long)*(short *)((long)&local_b0.message_.ptr_[-1].field_2 + 8) * 0x10;
      dVar7 = *(double *)(pica::ParticleTypes::types + lVar4);
      if (((dVar6 != dVar7) ||
          ((NAN(dVar6) || NAN(dVar7) ||
           (dVar8 = local_70.p.x * 29979245800.0 * dVar6,
           dVar9 = *(double *)&local_b0.message_.ptr_[-2].field_2 * 29979245800.0 * dVar7,
           dVar8 != dVar9)))) ||
         ((NAN(dVar8) || NAN(dVar9) ||
          (((((dVar8 = local_70.p.y * 29979245800.0 * dVar6,
              dVar9 = *(double *)((long)&local_b0.message_.ptr_[-2].field_2 + 8) * 29979245800.0 *
                      dVar7, dVar8 != dVar9 || (NAN(dVar8) || NAN(dVar9))) ||
             (dVar6 = local_70.p.z * 29979245800.0 * dVar6,
             dVar7 = (double)local_b0.message_.ptr_[-1]._M_dataplus._M_p * 29979245800.0 * dVar7,
             dVar6 != dVar7)) ||
            ((NAN(dVar6) || NAN(dVar7) ||
             (dVar6 = *(double *)(pica::ParticleTypes::types + 8 + (long)local_70.typeIndex * 0x10),
             pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar4), dVar6 != *pdVar1)))) ||
           (NAN(dVar6) || NAN(*pdVar1))))))) goto LAB_0019cb63;
      dVar6 = (double)local_b0.message_.ptr_[-1]._M_string_length;
      local_c8.success_ = local_70.factor == dVar6;
      local_c8.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_70.factor != dVar6) || (NAN(local_70.factor) || NAN(dVar6))) goto LAB_0019cb70;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar2 = (void *)CONCAT71(local_b0._1_7_,local_b0.success_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,local_a0 - (long)pvVar2);
    }
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      if (local_98.
          super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}